

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O3

GCstr * lj_parse_keepstr(LexState *ls,char *str,size_t len)

{
  lua_State *L;
  uint64_t uVar1;
  GCstr *key;
  TValue *pTVar2;
  
  L = ls->L;
  key = lj_str_new(L,str,len);
  pTVar2 = lj_tab_setstr(L,ls->fs->kt,key);
  if (pTVar2->u64 == 0xffffffffffffffff) {
    pTVar2->u64 = 0xfffeffffffffffff;
  }
  uVar1 = (L->glref).ptr64;
  if (*(ulong *)(uVar1 + 0x18) <= *(ulong *)(uVar1 + 0x10)) {
    lj_gc_step(L);
  }
  return key;
}

Assistant:

GCstr *lj_parse_keepstr(LexState *ls, const char *str, size_t len)
{
  /* NOBARRIER: the key is new or kept alive. */
  lua_State *L = ls->L;
  GCstr *s = lj_str_new(L, str, len);
  TValue *tv = lj_tab_setstr(L, ls->fs->kt, s);
  if (tvisnil(tv)) setboolV(tv, 1);
  lj_gc_check(L);
  return s;
}